

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputImpl.cpp
# Opt level: O0

void sf::priv::InputImpl::setMousePosition(Vector2i *position,WindowBase *relativeTo)

{
  Display *pDVar1;
  Display *display_00;
  undefined4 *in_RDI;
  WindowHandle handle;
  Display *display;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  pDVar1 = OpenDisplay();
  display_00 = (Display *)
               WindowBase::getSystemHandle
                         ((WindowBase *)
                          CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  if (display_00 != (Display *)0x0) {
    XWarpPointer(pDVar1,0,display_00,0,0,0,0,*in_RDI,in_RDI[1]);
    XFlush(pDVar1);
  }
  CloseDisplay(display_00);
  return;
}

Assistant:

void InputImpl::setMousePosition(const Vector2i& position, const WindowBase& relativeTo)
{
    // Open a connection with the X server
    Display* display = OpenDisplay();

    WindowHandle handle = relativeTo.getSystemHandle();
    if (handle)
    {
        XWarpPointer(display, None, handle, 0, 0, 0, 0, position.x, position.y);
        XFlush(display);
    }

    // Close the connection with the X server
    CloseDisplay(display);
}